

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O1

pair<int,_int> __thiscall
GameEngine::getDestinationPos(GameEngine *this,shared_ptr<Population> *tempPopulation)

{
  int32_t iVar1;
  uint uVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  RandomGenerator *pRVar6;
  size_t sVar7;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar8;
  pair<int,_int> pVar9;
  bool bVar10;
  
  iVar1 = Population::GetXPos((tempPopulation->
                              super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  uVar2 = Population::GetYPos((tempPopulation->
                              super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  pRVar6 = RandomGenerator::getInstance();
  iVar3 = RandomGenerator::randInt(pRVar6,-1,1);
  pRVar6 = RandomGenerator::getInstance();
  iVar4 = RandomGenerator::randInt(pRVar6,-1,1);
  if ((int)(iVar4 + uVar2) < 0) {
    iVar4 = 1;
  }
  sVar7 = Map::getHeight((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (sVar7 <= (ulong)(long)(int)(uVar2 + 1)) {
    iVar4 = -1;
  }
  if (iVar4 != 0) {
    pRVar6 = RandomGenerator::getInstance();
    bVar10 = (uVar2 & 0x80000001) != 1;
    if (bVar10) {
      iVar3 = -1;
    }
    else {
      iVar3 = 0;
    }
    iVar3 = RandomGenerator::randInt(pRVar6,iVar3,(uint)!bVar10);
  }
  if (iVar3 + iVar1 < 0) {
LAB_00128bd5:
    iVar3 = 0;
  }
  else {
    sVar7 = Map::getWidth((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (sVar7 <= (uint)(iVar3 + iVar1)) goto LAB_00128bd5;
  }
  pvVar8 = Map::operator[]((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           (long)(int)(uVar2 + iVar4));
  iVar5 = CellType::getCarnivoreCount
                    ((pvVar8->
                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[iVar1 + iVar3].
                     super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (iVar5 < 1) {
    pvVar8 = Map::operator[]((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             (long)(int)(uVar2 + iVar4));
    iVar1 = CellType::getHerbivoreCount
                      ((pvVar8->
                       super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[iVar1 + iVar3].
                       super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (iVar1 < 1) goto LAB_00128c24;
  }
  iVar3 = 0;
  iVar4 = 0;
LAB_00128c24:
  pVar9.second = iVar4;
  pVar9.first = iVar3;
  return pVar9;
}

Assistant:

std::pair<int32_t, int32_t> GameEngine::getDestinationPos(std::shared_ptr<Population> tempPopulation) {
  int32_t xPos = tempPopulation->GetXPos();
  int32_t yPos = tempPopulation->GetYPos();
  int32_t dX = RandomGenerator::getInstance().randInt(-1, 1);
  int32_t dY = RandomGenerator::getInstance().randInt(-1, 1);
  if (yPos + dY < 0) {
    dY = 1;
  }
  if (yPos + 1 >= map->getHeight()) {
    dY = -1;
  }
  if (dY != 0) {
    if (yPos % 2 == 1) {
      dX = RandomGenerator::getInstance().randInt(0, 1);
    } else {
      dX = RandomGenerator::getInstance().randInt(-1, 0);
    }
  }
  if (xPos + dX < 0 || xPos + dX >= map->getWidth()) {
    dX = 0;
  }
  if ((*map)[yPos + dY][xPos + dX]->getCarnivoreCount() > 0 || (*map)[yPos + dY][xPos + dX]->getHerbivoreCount() > 0) {
    dX = 0;
    dY = 0;
  }
  return std::make_pair(dX, dY);
}